

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O2

void __thiscall
higan::TcpServer::TcpServer(TcpServer *this,EventLoop *loop,InetAddress *addr,string *server_name)

{
  _Rb_tree_header *p_Var1;
  InetAddress *address;
  _Bind<void_(higan::TcpServer::*(higan::TcpServer_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(int,_const_higan::InetAddress_&)>
  local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  EventLoopThreadPool *local_48;
  InetAddress *local_38;
  
  this->loop_ = loop;
  local_38 = addr;
  std::operator+(&local_68,server_name,"Pool");
  local_48 = &this->thread_pool_;
  EventLoopThreadPool::EventLoopThreadPool(&this->thread_pool_,&local_68,loop);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string((string *)&this->server_name_,(string *)server_name);
  address = local_38;
  InetAddress::InetAddress(&this->server_addr_,local_38);
  Acceptor::Acceptor(&this->acceptor_,this->loop_,address);
  p_Var1 = &(this->connection_map_)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->connection_map_)._M_t._M_impl = 0;
  *(undefined8 *)&(this->connection_map_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->connection_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->connection_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->connection_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->connection_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->message_callback_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->message_callback_).super__Function_base._M_functor + 8) = 0;
  (this->message_callback_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->message_callback_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->newconnection_callback_).super__Function_base._M_functor = 0;
  (this->newconnection_callback_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)((long)&(this->newconnection_callback_).super__Function_base._M_functor + 8) = 0;
  (this->newconnection_callback_).super__Function_base._M_manager = (_Manager_type)0x0;
  local_80._M_f = (offset_in_TcpServer_to_subr)OnNewConnection;
  local_80._8_8_ = 0;
  local_80._M_bound_args.
  super__Tuple_impl<0UL,_higan::TcpServer_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>.
  super__Head_base<0UL,_higan::TcpServer_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_higan::TcpServer_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>)
       (_Tuple_impl<0UL,_higan::TcpServer_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>)this;
  std::function<void(int,higan::InetAddress_const&)>::
  function<std::_Bind<void(higan::TcpServer::*(higan::TcpServer*,std::_Placeholder<1>,std::_Placeholder<2>))(int,higan::InetAddress_const&)>,void>
            ((function<void(int,higan::InetAddress_const&)> *)&local_68,&local_80);
  Acceptor::SetNewConnectionCallback(&this->acceptor_,(NewConnectionCallback *)&local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  return;
}

Assistant:

TcpServer::TcpServer(EventLoop* loop, const InetAddress& addr, const std::string& server_name):
		loop_(loop),
		thread_pool_(server_name + "Pool", loop),
		server_name_(server_name),
		server_addr_(addr),
		acceptor_(loop_, addr),
		connection_map_()
{
	acceptor_.SetNewConnectionCallback(std::bind(&TcpServer::OnNewConnection,
			this, _1, _2));
}